

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::start_rx_queue(IxgbeDevice *this,uint16_t queue_id)

{
  pointer piVar1;
  uint8_t *puVar2;
  undefined2 uVar3;
  pointer piVar4;
  ixgbe_adv_rx_desc *piVar5;
  iterator __position;
  uint uVar6;
  int iVar7;
  uint64_t uVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  optional<unsigned_long> oVar14;
  optional<unsigned_long> buf;
  ushort local_8a;
  uint local_88;
  uint local_84;
  IxgbeDevice *local_80;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_78;
  _Storage<unsigned_long,_true> local_68;
  char *local_60;
  uint *local_58;
  char *local_50;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_48;
  char *local_40;
  uint *local_38;
  
  local_58 = (uint *)&local_8a;
  local_60 = "starting rx queue ";
  local_8a = queue_id;
  debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0xe8,"start_rx_queue",
             (LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> *)
             &local_68);
  uVar12 = (ulong)local_8a;
  piVar4 = (this->rx_queues).
           super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->rx_queues).
                  super__Vector_base<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 3) *
           0x6db6db6db6db6db7;
  if (uVar11 < uVar12 || uVar11 - uVar12 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  else {
    piVar1 = piVar4 + uVar12;
    uVar3 = piVar4[uVar12].num_entries;
    local_80 = this;
    if ((uVar3 & uVar3 - 1) != 0) {
      local_60 = "number of queue entries must be a power of 2";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                 ,0xec,"start_rx_queue",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_68);
    }
    if (piVar1->num_entries != 0) {
      lVar13 = 8;
      uVar11 = 0;
      do {
        oVar14 = Mempool::alloc_buf((piVar1->mempool).
                                    super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
        local_68._M_value =
             oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_60 = (char *)CONCAT71(local_60._1_7_,
                                    oVar14.super__Optional_base<unsigned_long,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_long>.
                                    _M_engaged);
        if (((undefined1  [16])
             oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          local_78.list.second = "failed to allocate rx descriptor";
          error<ixy::Pair<ixy::None,char_const*>>
                    ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                     ,0xf3,"start_rx_queue",&local_78);
        }
        if ((char)local_60 == '\0') {
LAB_00107663:
          std::__throw_bad_optional_access();
        }
        piVar5 = piVar1->descriptors;
        uVar8 = Mempool::get_phys_addr
                          ((piVar1->mempool).
                           super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           local_68._M_value);
        *(uint64_t *)((long)piVar5 + lVar13 + -8) = uVar8;
        *(undefined8 *)((long)piVar5 + lVar13) = 0;
        if ((char)local_60 == '\0') goto LAB_00107663;
        __position._M_current =
             *(pointer *)
              ((long)&(piVar1->bufs_in_use).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (__position._M_current ==
            *(pointer *)
             ((long)&(piVar1->bufs_in_use).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&piVar1->bufs_in_use,
                     __position,&local_68._M_value);
        }
        else {
          *__position._M_current = (unsigned_long)local_68;
          *(unsigned_long **)
           ((long)&(piVar1->bufs_in_use).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               __position._M_current + 1;
        }
        uVar11 = uVar11 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar11 < piVar1->num_entries);
    }
    uVar6 = (uint)local_8a * 0x40 + 0xc028;
    if (local_8a < 0x40) {
      uVar6 = (uint)local_8a * 0x40 | 0x1028;
    }
    uVar11 = (ulong)uVar6;
    if (uVar11 <= local_80->len - 4) {
      if (uVar11 <= local_80->len - 4) {
        *(uint *)(local_80->addr + uVar11) = *(uint *)(local_80->addr + uVar11) | 0x2000000;
        uVar10 = (uint)local_8a * 0x40;
        uVar6 = uVar10 + 0xc028;
        if (local_8a < 0x40) {
          uVar6 = uVar10 | 0x1028;
        }
        local_78.list._0_8_ = ZEXT48(uVar6);
        local_88 = 0x2000000;
        local_84 = *(uint *)(local_80->addr + local_78.list._0_8_);
        if ((~local_84 & 0x2000000) != 0) {
          do {
            local_60 = "waiting for flags ";
            local_58 = &local_88;
            local_50 = " in register ";
            local_48 = &local_78;
            local_40 = ", current value ";
            local_38 = &local_84;
            debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>,char_const*>,unsigned_long_const&>,char_const*>,unsigned_int_const&>>
                      ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                       ,0x1ee,"wait_set_reg32",
                       (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>,_const_char_*>,_const_unsigned_int_&>_>
                        *)&local_68);
            local_68._M_value = 0;
            local_60 = (char *)0x989680;
            do {
              iVar7 = nanosleep((timespec *)&local_68,(timespec *)&local_68);
              if (iVar7 != -1) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            local_84 = *(uint *)(local_80->addr + local_78.list._0_8_);
          } while ((local_88 & ~local_84) != 0);
        }
        uVar6 = (uint)local_8a * 0x40 + 0xc010;
        if (local_8a < 0x40) {
          uVar6 = (uint)local_8a * 0x40 | 0x1010;
        }
        if ((ulong)uVar6 <= local_80->len - 4) {
          puVar2 = local_80->addr + uVar6;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          uVar6 = (uint)local_8a * 0x40 + 0xc018;
          if (local_8a < 0x40) {
            uVar6 = (uint)local_8a * 0x40 | 0x1018;
          }
          if ((ulong)uVar6 <= local_80->len - 4) {
            *(uint *)(local_80->addr + uVar6) = piVar1->num_entries - 1;
            return;
          }
        }
      }
      __assert_fail("reg <= len - 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                    ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
    }
  }
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

void IxgbeDevice::start_rx_queue(uint16_t queue_id) {
    debug("starting rx queue " << queue_id);
    auto queue = &rx_queues.at(queue_id);

    if (queue->num_entries & (queue->num_entries - 1)) {
        error("number of queue entries must be a power of 2");
    }

    for (int i = 0; i < queue->num_entries; i++) {
        auto buf = queue->mempool->alloc_buf();

        if (!buf.has_value()) {
            error("failed to allocate rx descriptor");
        }

        volatile union ixgbe_adv_rx_desc *rxd = queue->descriptors + i;
        rxd->read.pkt_addr = queue->mempool->get_phys_addr(buf.value());
        rxd->read.hdr_addr = 0;

        queue->bufs_in_use.push_back(buf.value());
    }

    // enable queue and wait if necessary
    set_flags32(IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
    wait_set_reg32(IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
    // rx queue starts out full
    set_reg32(IXGBE_RDH(queue_id), 0);
    // was set to 0 before in the init function
    set_reg32(IXGBE_RDT(queue_id), queue->num_entries - 1);
}